

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O1

Gia_Man_t * Ssc_PerformSweepingInt(Gia_Man_t *pAig,Gia_Man_t *pCare,Ssc_Pars_t *pPars)

{
  int iVar1;
  Gia_Rpr_t GVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  Ssc_Man_t *pSVar7;
  Gia_Man_t *pGVar8;
  Gia_Man_t *p;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  Gia_Obj_t *pGVar14;
  uint uVar15;
  int iVar16;
  Gia_Obj_t *pGVar17;
  long lVar18;
  timespec ts;
  timespec local_68;
  Ssc_Man_t *local_58;
  Ssc_Pars_t *local_50;
  Gia_Obj_t *local_48;
  undefined8 *local_40;
  long local_38;
  
  iVar5 = clock_gettime(3,&local_68);
  if (iVar5 < 0) {
    lVar18 = -1;
  }
  else {
    lVar18 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  iVar5 = clock_gettime(3,&local_68);
  if (iVar5 < 0) {
    lVar10 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  if (pCare->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pCare) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0x110,"Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                 );
  }
  if (pAig->vCis->nSize != pCare->vCis->nSize) {
    __assert_fail("Gia_ManCiNum(pAig) == Gia_ManCiNum(pCare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0x111,"Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                 );
  }
  iVar5 = Gia_ManIsNormalized(pAig);
  if (iVar5 == 0) {
    __assert_fail("Gia_ManIsNormalized(pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0x112,"Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                 );
  }
  iVar5 = Gia_ManIsNormalized(pCare);
  if (iVar5 == 0) {
    __assert_fail("Gia_ManIsNormalized(pCare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                  ,0x113,"Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                 );
  }
  Gia_ManRandom(1);
  pSVar7 = Ssc_ManStart(pAig,pCare,pPars);
  if (pSVar7 == (Ssc_Man_t *)0x0) {
    pGVar8 = Gia_ManDup(pAig);
  }
  else if (pSVar7 == (Ssc_Man_t *)0x1) {
    pGVar8 = Gia_ManDupZero(pAig);
  }
  else {
    if (pSVar7->pPars->fVerbose != 0) {
      uVar6 = Ssc_GiaEstimateCare(pSVar7->pFraig,5);
      printf("Care set produced %d hits out of %d.\n",(ulong)uVar6,0x280);
    }
    do {
      Ssc_GiaRandomPiPattern(pSVar7->pFraig,5,(Vec_Int_t *)0x0);
      Ssc_GiaSimRound(pSVar7->pFraig);
      iVar5 = Ssc_GiaTransferPiPattern(pAig,pSVar7->pFraig,pSVar7->vPivot);
      if (iVar5 == 0) break;
      Ssc_GiaSimRound(pAig);
      iVar5 = Ssc_GiaClassesRefine(pAig);
      if (pPars->fVerbose != 0) {
        Gia_ManEquivPrintClasses(pAig,0,0.0);
      }
      iVar1 = pAig->vCis->nSize;
    } while ((iVar1 + pAig->nObjs + ~(pAig->vCos->nSize + iVar1)) / 100 < iVar5);
    iVar5 = clock_gettime(3,&local_68);
    if (iVar5 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
    }
    pSVar7->timeSimInit = pSVar7->timeSimInit + lVar11 + lVar10;
    local_38 = lVar18;
    Gia_ManFillValue(pAig);
    pGVar3 = pAig->pObjs;
    pGVar3->Value = 0;
    lVar18 = (long)pAig->vCis->nSize;
    if (0 < lVar18) {
      piVar4 = pAig->vCis->pArray;
      lVar10 = 0;
      do {
        iVar5 = piVar4[lVar10];
        if (((long)iVar5 < 0) || (pAig->nObjs <= iVar5)) goto LAB_005b6c3f;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        pGVar8 = pSVar7->pFraig;
        if (pGVar8->vCis->nSize <= lVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar1 = pGVar8->vCis->pArray[lVar10];
        if (((long)iVar1 < 0) || (pGVar8->nObjs <= iVar1)) goto LAB_005b6c3f;
        pGVar14 = pGVar8->pObjs;
        pGVar17 = (Gia_Obj_t *)((ulong)(pGVar14 + iVar1) & 0xfffffffffffffffe);
        if ((pGVar17 < pGVar14) || (pGVar14 + pGVar8->nObjs <= pGVar17)) {
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar16 = (int)((ulong)((long)pGVar17 - (long)pGVar14) >> 2);
        if (iVar16 * -0x55555555 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf1,"int Abc_Var2Lit(int, int)");
        }
        pGVar3[iVar5].Value = ((uint)(pGVar14 + iVar1) & 1) + iVar16 * 0x55555556;
        lVar10 = lVar10 + 1;
      } while (lVar18 != lVar10);
    }
    Gia_ManHashStart(pSVar7->pFraig);
    Ssc_GiaResetPiPattern(pAig,pPars->nWords);
    local_58 = pSVar7;
    Ssc_GiaSavePiPattern(pAig,pSVar7->vPivot);
    if (0 < pAig->nObjs) {
      lVar10 = 8;
      lVar18 = 0;
      local_50 = pPars;
      do {
        pGVar3 = pAig->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        uVar6 = *(uint *)((long)pGVar3 + lVar10 + -8);
        uVar9 = ~uVar6;
        if (((uVar9 & 0x9fffffff) == 0) || (-1 < (int)uVar6 && (uVar9 & 0x1fffffff) != 0)) {
          if (pAig->iPatsPi == pPars->nWords << 6) {
            iVar5 = clock_gettime(3,&local_68);
            if (iVar5 < 0) {
              lVar11 = 1;
            }
            else {
              lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
              lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_68.tv_sec * -1000000;
            }
            Ssc_GiaSimRound(pAig);
            Ssc_GiaClassesRefine(pAig);
            if (local_50->fVerbose != 0) {
              Gia_ManEquivPrintClasses(pAig,0,0.0);
            }
            pSVar7 = local_58;
            Ssc_GiaClassesCheckPairs(pAig,local_58->vDisPairs);
            pSVar7->vDisPairs->nSize = 0;
            Ssc_GiaResetPiPattern(pAig,local_50->nWords);
            Ssc_GiaSavePiPattern(pAig,pSVar7->vPivot);
            iVar5 = clock_gettime(3,&local_68);
            if (iVar5 < 0) {
              lVar12 = -1;
            }
            else {
              lVar12 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
            }
            local_58->timeSimSat = local_58->timeSimSat + lVar12 + lVar11;
            pPars = local_50;
          }
          uVar13 = *(ulong *)((long)pGVar3 + lVar10 + -8);
          if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
            uVar6 = *(uint *)((long)pGVar3 +
                             lVar10 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3);
            if (((int)uVar6 < 0) ||
               (uVar9 = *(uint *)((long)pGVar3 +
                                 lVar10 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar9 < 0)) goto LAB_005b6cbb;
            iVar5 = Gia_ManHashAnd(local_58->pFraig,uVar6 ^ (uint)(uVar13 >> 0x1d) & 1,
                                   uVar9 ^ (uint)(uVar13 >> 0x3d) & 1);
            *(int *)(&pGVar3->field_0x0 + lVar10) = iVar5;
          }
          GVar2 = pAig->pReprs[lVar18];
          uVar13 = (ulong)(uint)GVar2 & 0xfffffff;
          if (uVar13 != 0xfffffff) {
            if (pAig->nObjs <= (int)uVar13) {
LAB_005b6c3f:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            pGVar14 = pAig->pObjs;
            uVar6 = pGVar14[uVar13].Value;
            if ((int)uVar6 < 0) {
LAB_005b6cbb:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                            ,0xf5,"int Abc_LitNotCond(int, int)");
            }
            uVar9 = *(uint *)(&pGVar3->field_0x0 + lVar10);
            uVar15 = ((uint)((ulong)*(undefined8 *)((long)pGVar3 + lVar10 + -8) >> 0x20) ^
                     (uint)((ulong)*(undefined8 *)(pGVar14 + uVar13) >> 0x20)) >> 0x1f;
            if (uVar9 == (uVar6 ^ uVar15)) {
              pAig->pReprs[lVar18] = (Gia_Rpr_t)((uint)GVar2 | 0x10000000);
              pPars = local_50;
            }
            else {
              if ((int)uVar9 < 0) {
LAB_005b6cda:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                              ,0xf2,"int Abc_Lit2Var(int)");
              }
              local_48 = pGVar14;
              local_40 = (undefined8 *)(uVar13 * 3);
              if ((uVar6 ^ uVar9) < 2) {
                __assert_fail("Abc_Lit2Var(pRepr->Value) != Abc_Lit2Var(pObj->Value)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                              ,0x157,
                              "Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                             );
              }
              iVar5 = clock_gettime(3,&local_68);
              if (iVar5 < 0) {
                pGVar14 = (Gia_Obj_t *)0x1;
              }
              else {
                lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
                pGVar14 = (Gia_Obj_t *)
                          (((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_68.tv_sec * -1000000);
              }
              local_58->nSatCalls = local_58->nSatCalls + 1;
              local_40 = (undefined8 *)(&local_48->field_0x0 + (long)local_40 * 4);
              if (((int)*(uint *)(local_40 + 1) < 0) ||
                 (local_48 = pGVar14, (int)*(uint *)(&pGVar3->field_0x0 + lVar10) < 0))
              goto LAB_005b6cda;
              iVar5 = Ssc_ManCheckEquivalence
                                (local_58,*(uint *)(local_40 + 1) >> 1,
                                 *(uint *)(&pGVar3->field_0x0 + lVar10) >> 1,
                                 (uVar6 ^ uVar9) & 1 ^ uVar15);
              pSVar7 = local_58;
              if (iVar5 == 1) {
                local_58->nSatCallsSat = local_58->nSatCallsSat + 1;
                Ssc_GiaSavePiPattern(pAig,local_58->vPattern);
                Vec_IntPush(pSVar7->vDisPairs,(uint)pSVar7->pAig->pReprs[lVar18] & 0xfffffff);
                Vec_IntPush(pSVar7->vDisPairs,(int)lVar18);
                pPars = local_50;
                uVar6 = (uint)pSVar7->pAig->pReprs[lVar18] & 0xfffffff;
                if (uVar6 != 0) {
                  Ssc_GiaResimulateOneClass(pSVar7,uVar6,(int)lVar18);
                }
              }
              else {
                pPars = local_50;
                if (iVar5 == 0) {
                  local_58->nSatCallsUndec = local_58->nSatCallsUndec + 1;
                }
                else {
                  if (iVar5 != -1) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssc/sscCore.c"
                                  ,0x171,
                                  "Gia_Man_t *Ssc_PerformSweepingInt(Gia_Man_t *, Gia_Man_t *, Ssc_Pars_t *)"
                                 );
                  }
                  local_58->nSatCallsUnsat = local_58->nSatCallsUnsat + 1;
                  if ((int)*(uint *)(local_40 + 1) < 0) goto LAB_005b6cbb;
                  *(uint *)(&pGVar3->field_0x0 + lVar10) =
                       *(uint *)(local_40 + 1) ^
                       ((uint)((ulong)*(undefined8 *)((long)pGVar3 + lVar10 + -8) >> 0x20) ^
                       (uint)((ulong)*local_40 >> 0x20)) >> 0x1f;
                  pAig->pReprs[lVar18] = (Gia_Rpr_t)((uint)pAig->pReprs[lVar18] | 0x10000000);
                }
              }
              iVar5 = clock_gettime(3,&local_68);
              if (iVar5 < 0) {
                lVar11 = -1;
              }
              else {
                lVar11 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
              }
              pSVar7->timeSat = (abctime)(&local_48->field_0x0 + pSVar7->timeSat + lVar11);
            }
          }
        }
        lVar18 = lVar18 + 1;
        lVar10 = lVar10 + 0xc;
      } while (lVar18 < pAig->nObjs);
    }
    lVar18 = local_38;
    pSVar7 = local_58;
    if (1 < pAig->iPatsPi) {
      iVar5 = clock_gettime(3,&local_68);
      if (iVar5 < 0) {
        lVar10 = 1;
      }
      else {
        lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
        lVar10 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_68.tv_sec * -1000000;
      }
      while (pAig->iPatsPi < pPars->nWords * 0x40) {
        Ssc_GiaSavePiPattern(pAig,pSVar7->vPivot);
      }
      Ssc_GiaSimRound(pAig);
      Ssc_GiaClassesRefine(pAig);
      if (pPars->fVerbose != 0) {
        Gia_ManEquivPrintClasses(pAig,0,0.0);
      }
      Ssc_GiaClassesCheckPairs(pAig,pSVar7->vDisPairs);
      pSVar7->vDisPairs->nSize = 0;
      iVar5 = clock_gettime(3,&local_68);
      if (iVar5 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      pSVar7->timeSimSat = pSVar7->timeSimSat + lVar11 + lVar10;
    }
    p = Gia_ManEquivReduce(pAig,0,0,1,0);
    if (p == (Gia_Man_t *)0x0) {
      puts("There is no equivalences.");
      if (pAig->pReprs != (Gia_Rpr_t *)0x0) {
        free(pAig->pReprs);
        pAig->pReprs = (Gia_Rpr_t *)0x0;
      }
      if (pAig->pNexts != (int *)0x0) {
        free(pAig->pNexts);
        pAig->pNexts = (int *)0x0;
      }
      p = Gia_ManDup(pAig);
    }
    pGVar8 = Gia_ManCleanup(p);
    Gia_ManStop(p);
    iVar5 = clock_gettime(3,&local_68);
    if (iVar5 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
    }
    pSVar7->timeTotal = lVar10 - lVar18;
    if (pPars->fVerbose != 0) {
      Ssc_ManPrintStats(pSVar7);
    }
    Ssc_ManStop(pSVar7);
    if (pPars->fVerbose != 0) {
      Abc_Print(1,"Reduction in AIG nodes:%8d  ->%8d (%6.2f %%).  ",
                100.0 - ((double)(~(pGVar8->vCos->nSize + pGVar8->vCis->nSize) + pGVar8->nObjs) *
                        100.0) / (double)(~(pAig->vCos->nSize + pAig->vCis->nSize) + pAig->nObjs));
      iVar5 = clock_gettime(3,&local_68);
      if (iVar5 < 0) {
        lVar10 = -1;
      }
      else {
        lVar10 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
      }
      Abc_Print(1,"%s =","Time");
      Abc_Print(1,"%9.2f sec\n",(double)(lVar10 - lVar18) / 1000000.0);
    }
  }
  return pGVar8;
}

Assistant:

Gia_Man_t * Ssc_PerformSweepingInt( Gia_Man_t * pAig, Gia_Man_t * pCare, Ssc_Pars_t * pPars )
{
    Ssc_Man_t * p;
    Gia_Man_t * pResult, * pTemp;
    Gia_Obj_t * pObj, * pRepr;
    abctime clk, clkTotal = Abc_Clock();
    int i, fCompl, nRefined, status;
clk = Abc_Clock();
    assert( Gia_ManRegNum(pCare) == 0 );
    assert( Gia_ManCiNum(pAig) == Gia_ManCiNum(pCare) );
    assert( Gia_ManIsNormalized(pAig) );
    assert( Gia_ManIsNormalized(pCare) );
    // reset random numbers
    Gia_ManRandom( 1 );
    // sweeping manager
    p = Ssc_ManStart( pAig, pCare, pPars );
    if ( p == (Ssc_Man_t *)(ABC_PTRINT_T)1 ) // UNSAT
        return Gia_ManDupZero( pAig );
    if ( p == NULL ) // timeout
        return Gia_ManDup( pAig );
    if ( p->pPars->fVerbose )
        printf( "Care set produced %d hits out of %d.\n", Ssc_GiaEstimateCare(p->pFraig, 5), 640 );
    // perform simulation 
    while ( 1 ) 
    {
        // simulate care set
        Ssc_GiaRandomPiPattern( p->pFraig, 5, NULL );
        Ssc_GiaSimRound( p->pFraig );
        // transfer care patterns to user's AIG
        if ( !Ssc_GiaTransferPiPattern( pAig, p->pFraig, p->vPivot ) )
            break;
        // simulate the main AIG
        Ssc_GiaSimRound( pAig );
        nRefined = Ssc_GiaClassesRefine( pAig );
        if ( pPars->fVerbose ) 
            Gia_ManEquivPrintClasses( pAig, 0, 0 );
        if ( nRefined <= Gia_ManCandNum(pAig) / 100 )
            break;
    }
p->timeSimInit += Abc_Clock() - clk;

    // prepare user's AIG
    Gia_ManFillValue(pAig);
    Gia_ManConst0(pAig)->Value = 0;
    Gia_ManForEachCi( pAig, pObj, i )
        pObj->Value = Gia_Obj2Lit( p->pFraig, Gia_ManCi(p->pFraig, i) );
//    Gia_ManLevelNum(pAig);
    // prepare swept AIG (should be done after starting SAT solver in Ssc_ManStart)
    Gia_ManHashStart( p->pFraig );
    // perform sweeping
    Ssc_GiaResetPiPattern( pAig, pPars->nWords );
    Ssc_GiaSavePiPattern( pAig, p->vPivot );
    Gia_ManForEachCand( pAig, pObj, i )
    {
        if ( pAig->iPatsPi == 64 * pPars->nWords )
        {
clk = Abc_Clock();
            Ssc_GiaSimRound( pAig );
            Ssc_GiaClassesRefine( pAig );
            if ( pPars->fVerbose ) 
                Gia_ManEquivPrintClasses( pAig, 0, 0 );
            Ssc_GiaClassesCheckPairs( pAig, p->vDisPairs );
            Vec_IntClear( p->vDisPairs );
            // prepare next patterns
            Ssc_GiaResetPiPattern( pAig, pPars->nWords );
            Ssc_GiaSavePiPattern( pAig, p->vPivot );
p->timeSimSat += Abc_Clock() - clk;
//printf( "\n" );
        }
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( p->pFraig, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( !Gia_ObjHasRepr(pAig, i) )
            continue;
        pRepr = Gia_ObjReprObj(pAig, i);
        if ( (int)pObj->Value == Abc_LitNotCond( pRepr->Value, pRepr->fPhase ^ pObj->fPhase ) )
        {
            Gia_ObjSetProved( pAig, i );
            continue;
        }
        assert( Abc_Lit2Var(pRepr->Value) != Abc_Lit2Var(pObj->Value) );
        fCompl = pRepr->fPhase ^ pObj->fPhase ^ Abc_LitIsCompl(pRepr->Value) ^ Abc_LitIsCompl(pObj->Value);

        // perform SAT call
clk = Abc_Clock();
        p->nSatCalls++;
        status = Ssc_ManCheckEquivalence( p, Abc_Lit2Var(pRepr->Value), Abc_Lit2Var(pObj->Value), fCompl );
        if ( status == l_False )
        {
            p->nSatCallsUnsat++;
            pObj->Value = Abc_LitNotCond( pRepr->Value, pRepr->fPhase ^ pObj->fPhase );
            Gia_ObjSetProved( pAig, i );
        }
        else if ( status == l_True )
        {
            p->nSatCallsSat++;
            Ssc_GiaSavePiPattern( pAig, p->vPattern );
            Vec_IntPush( p->vDisPairs, Gia_ObjRepr(p->pAig, i) );
            Vec_IntPush( p->vDisPairs, i );
//            printf( "Try %2d and %2d: ", Gia_ObjRepr(p->pAig, i), i );
//            Vec_IntPrint( p->vPattern );
            if ( Gia_ObjRepr(p->pAig, i) > 0 )
                Ssc_GiaResimulateOneClass( p, Gia_ObjRepr(p->pAig, i), i );
        }
        else if ( status == l_Undef )
            p->nSatCallsUndec++;
        else assert( 0 );
p->timeSat += Abc_Clock() - clk;
    }
    if ( pAig->iPatsPi > 1 )
    {
clk = Abc_Clock();
        while ( pAig->iPatsPi < 64 * pPars->nWords )
            Ssc_GiaSavePiPattern( pAig, p->vPivot );
        Ssc_GiaSimRound( pAig );
        Ssc_GiaClassesRefine( pAig );
        if ( pPars->fVerbose ) 
            Gia_ManEquivPrintClasses( pAig, 0, 0 );
        Ssc_GiaClassesCheckPairs( pAig, p->vDisPairs );
        Vec_IntClear( p->vDisPairs );
p->timeSimSat += Abc_Clock() - clk;
    }
//    Gia_ManEquivPrintClasses( pAig, 1, 0 );
//    Gia_ManPrint( pAig );

    // generate the resulting AIG
    pResult = Gia_ManEquivReduce( pAig, 0, 0, 1, 0 );
    if ( pResult == NULL )
    {
        printf( "There is no equivalences.\n" );
        ABC_FREE( pAig->pReprs );
        ABC_FREE( pAig->pNexts );
        pResult = Gia_ManDup( pAig );
    }
    pResult = Gia_ManCleanup( pTemp = pResult );
    Gia_ManStop( pTemp );
    p->timeTotal = Abc_Clock() - clkTotal;
    if ( pPars->fVerbose )
        Ssc_ManPrintStats( p );
    Ssc_ManStop( p );
    // count the number of representatives
    if ( pPars->fVerbose ) 
    {
        Abc_Print( 1, "Reduction in AIG nodes:%8d  ->%8d (%6.2f %%).  ", 
            Gia_ManAndNum(pAig), Gia_ManAndNum(pResult), 
            100.0 - 100.0 * Gia_ManAndNum(pResult) / Gia_ManAndNum(pAig) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    }
    return pResult;
}